

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMI_ALG_SYM_OBJECT_Unmarshal
                 (TPMI_ALG_SYM_OBJECT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_ALG_SYM_OBJECT TVar1;
  TPM_RC TVar2;
  TPM_RC result;
  BOOL flag_local;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMI_ALG_SYM_OBJECT *target_local;
  
  TVar2 = UINT16_Unmarshal(target,buffer,size);
  if (TVar2 != 0) {
    return TVar2;
  }
  TVar1 = *target;
  if ((TVar1 != 3) && (TVar1 != 6)) {
    if (TVar1 != 0x10) {
      return 0x96;
    }
    if (flag == 0) {
      return 0x96;
    }
  }
  return 0;
}

Assistant:

TPM_RC
TPMI_ALG_SYM_OBJECT_Unmarshal(TPMI_ALG_SYM_OBJECT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_TDES
        case TPM_ALG_TDES:
#endif // ALG_TDES
#if         ALG_AES
        case TPM_ALG_AES:
#endif // ALG_AES
#if         ALG_SM4
        case TPM_ALG_SM4:
#endif // ALG_SM4
#if         ALG_CAMELLIA
        case TPM_ALG_CAMELLIA:
#endif // ALG_CAMELLIA
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_SYMMETRIC;
        default:
            return TPM_RC_SYMMETRIC;
    }
    return TPM_RC_SUCCESS;
}